

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *data_00;
  long lVar1;
  _Bool _Var2;
  char local_b8 [8];
  char key [128];
  int rc;
  Curl_easy *data;
  connectbundle *bundle;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  conncache *connc_local;
  
  bundle._4_4_ = CURLE_OK;
  data = (Curl_easy *)0x0;
  data_00 = conn->data;
  pcStack_18 = conn;
  conn_local = (connectdata *)connc;
  data = (Curl_easy *)Curl_conncache_find_bundle(conn,(data_00->state).conn_cache,(char **)0x0);
  if (data == (Curl_easy *)0x0) {
    bundle._4_4_ = bundle_create((connectbundle **)&data);
    if (bundle._4_4_ != CURLE_OK) goto LAB_0010debc;
    hashkey(pcStack_18,local_b8,0x80,(char **)0x0);
    _Var2 = conncache_add_bundle((data_00->state).conn_cache,local_b8,(connectbundle *)data);
    key._124_4_ = ZEXT14(_Var2);
    if (key._124_4_ == 0) {
      bundle_destroy((connectbundle *)data);
      bundle._4_4_ = CURLE_OUT_OF_MEMORY;
      goto LAB_0010debc;
    }
  }
  bundle_add_conn((connectbundle *)data,pcStack_18);
  lVar1 = *(long *)((conn_local->cnnct).socksreq + 0x2c);
  *(long *)((conn_local->cnnct).socksreq + 0x2c) = lVar1 + 1;
  pcStack_18->connection_id = lVar1;
  *(long *)((conn_local->cnnct).socksreq + 0x24) =
       *(long *)((conn_local->cnnct).socksreq + 0x24) + 1;
LAB_0010debc:
  if (data_00->share != (Curl_share *)0x0) {
    Curl_share_unlock(data_00,CURL_LOCK_DATA_CONNECT);
  }
  return bundle._4_4_;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle = NULL;
  struct Curl_easy *data = conn->data;

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache, NULL);
  if(!bundle) {
    int rc;
    char key[HASHKEY_SIZE];

    result = bundle_create(&bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key), NULL);
    rc = conncache_add_bundle(data->state.conn_cache, key, bundle);

    if(!rc) {
      bundle_destroy(bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %zu members\n",
               conn->connection_id, connc->num_conn));

  unlock:
  CONNCACHE_UNLOCK(data);

  return result;
}